

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int *piVar14;
  double *pdVar15;
  uint uVar16;
  double *pdVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  double *pdVar26;
  double *pdVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  if (0 < partitionCount) {
    uVar25 = 0;
    do {
      iVar5 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar25]];
      iVar6 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar25] + 1];
      lVar21 = (long)iVar6;
      lVar22 = (long)iVar5;
      memset(this->integrationTmp + this->kStateCount * iVar5,0,
             (long)((iVar6 - iVar5) * this->kStateCount) << 3);
      iVar7 = cumulativeScaleIndices[uVar25];
      pdVar10 = this->gTransitionMatrices[probabilityIndices[uVar25]];
      iVar36 = childBufferIndices[uVar25];
      pdVar11 = this->gCategoryWeights[categoryWeightsIndices[uVar25]];
      pdVar12 = this->gStateFrequencies[stateFrequenciesIndices[uVar25]];
      pdVar13 = this->gPartials[parentBufferIndices[uVar25]];
      if ((iVar36 < this->kTipCount) && (piVar14 = this->gTipStates[iVar36], piVar14 != (int *)0x0))
      {
        iVar36 = this->kCategoryCount;
        uVar35 = this->kStateCount;
        if (0 < (long)iVar36) {
          iVar8 = this->kPartialsPaddedStateCount;
          iVar9 = this->kMatrixSize;
          lVar37 = 0;
          iVar29 = 0;
          iVar31 = iVar8 * iVar5;
          iVar20 = this->kPatternCount;
          do {
            if (iVar5 < iVar6) {
              pdVar26 = this->integrationTmp;
              iVar19 = this->kTransPaddedStateCount;
              lVar32 = (long)iVar31;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = pdVar11[lVar37];
              pdVar27 = pdVar13 + lVar32;
              lVar23 = lVar22;
              iVar28 = uVar35 * iVar5;
              do {
                if (0 < (int)uVar35) {
                  uVar30 = 0;
                  pdVar17 = pdVar10 + (long)iVar29 + (long)piVar14[lVar23];
                  do {
                    dVar38 = *pdVar17;
                    pdVar17 = pdVar17 + iVar19;
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar26[(long)iVar28 + uVar30];
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = dVar38 * pdVar27[uVar30];
                    auVar40 = vfmadd213sd_fma(auVar42,auVar39,auVar1);
                    pdVar26[(long)iVar28 + uVar30] = auVar40._0_8_;
                    uVar30 = uVar30 + 1;
                  } while (uVar35 != uVar30);
                  iVar28 = iVar28 + (int)uVar30;
                }
                lVar32 = lVar32 + iVar8;
                iVar31 = (int)lVar32;
                lVar23 = lVar23 + 1;
                pdVar27 = pdVar27 + iVar8;
              } while (lVar23 != lVar21);
            }
            iVar31 = iVar31 + ((iVar5 - iVar6) + iVar20) * iVar8;
            lVar37 = lVar37 + 1;
            iVar29 = iVar29 + iVar9;
          } while (lVar37 != iVar36);
        }
      }
      else {
        uVar35 = this->kStateCount;
        iVar8 = this->kCategoryCount;
        if (0 < (long)iVar8) {
          pdVar27 = this->gPartials[iVar36];
          iVar36 = this->kPartialsPaddedStateCount;
          lVar37 = (long)iVar36;
          iVar9 = this->kMatrixSize;
          iVar20 = 0;
          uVar16 = uVar35 + 3;
          if (-1 < (int)uVar35) {
            uVar16 = uVar35;
          }
          uVar24 = iVar36 * iVar5;
          iVar29 = this->kPatternCount;
          lVar23 = 0;
          do {
            uVar30 = (ulong)uVar24;
            if (iVar5 < iVar6) {
              pdVar15 = this->integrationTmp;
              uVar30 = (ulong)(int)uVar24;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = pdVar11[lVar23];
              uVar34 = (ulong)(uVar35 * iVar5);
              pdVar26 = pdVar27 + uVar30 + 2;
              pdVar17 = pdVar27 + uVar30;
              iVar31 = iVar5;
              do {
                if (0 < (int)uVar35) {
                  uVar34 = (ulong)(int)uVar34;
                  uVar33 = 0;
                  iVar19 = iVar20;
                  do {
                    if ((int)uVar35 < 4) {
                      auVar43 = ZEXT816(0);
                      uVar18 = 0;
                    }
                    else {
                      auVar43 = ZEXT816(0);
                      uVar18 = 0;
                      do {
                        auVar43 = vfmadd231pd_fma(auVar43,*(undefined1 (*) [16])
                                                           (pdVar10 + (long)iVar19 + uVar18),
                                                  *(undefined1 (*) [16])(pdVar26 + (uVar18 - 2)));
                        auVar43 = vfmadd231pd_fma(auVar43,*(undefined1 (*) [16])
                                                           (pdVar10 + (long)iVar19 + uVar18 + 2),
                                                  *(undefined1 (*) [16])(pdVar26 + uVar18));
                        uVar18 = uVar18 + 4;
                      } while ((long)uVar18 < (long)(int)(uVar16 & 0xfffffffc));
                    }
                    dVar38 = auVar43._0_8_;
                    if ((int)uVar18 < (int)uVar35) {
                      uVar18 = uVar18 & 0xffffffff;
                      auVar39 = auVar43;
                      do {
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = pdVar10[(long)iVar19 + uVar18];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar17[uVar18];
                        auVar39 = vfmadd231sd_fma(auVar39,auVar47,auVar2);
                        dVar38 = auVar39._0_8_;
                        uVar18 = uVar18 + 1;
                      } while (uVar35 != uVar18);
                    }
                    auVar39 = vshufpd_avx(auVar43,auVar43,1);
                    iVar19 = iVar19 + uVar35 + 1;
                    lVar32 = uVar30 + uVar33;
                    uVar33 = uVar33 + 1;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = pdVar15[uVar34];
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = (auVar39._0_8_ + dVar38) * pdVar13[lVar32];
                    auVar43 = vfmadd213sd_fma(auVar44,auVar40,auVar43);
                    pdVar15[uVar34] = auVar43._0_8_;
                    uVar34 = uVar34 + 1;
                  } while (uVar33 != uVar35);
                }
                uVar30 = uVar30 + lVar37;
                iVar31 = iVar31 + 1;
                pdVar26 = pdVar26 + lVar37;
                pdVar17 = pdVar17 + lVar37;
              } while (iVar31 != iVar6);
            }
            uVar24 = (int)uVar30 + ((iVar5 - iVar6) + iVar29) * iVar36;
            lVar23 = lVar23 + 1;
            iVar20 = iVar20 + iVar9;
          } while (lVar23 != iVar8);
        }
      }
      if (iVar5 < iVar6) {
        iVar36 = uVar35 * iVar5;
        lVar37 = lVar22;
        do {
          iVar8 = this->kStateCount;
          if ((long)iVar8 < 1) {
            dVar38 = 0.0;
          }
          else {
            auVar40 = ZEXT816(0);
            lVar23 = 0;
            do {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = pdVar12[lVar23];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = this->integrationTmp[iVar36 + lVar23];
              auVar40 = vfmadd231sd_fma(auVar40,auVar45,auVar3);
              dVar38 = auVar40._0_8_;
              lVar23 = lVar23 + 1;
            } while (iVar8 != lVar23);
            iVar36 = iVar36 + iVar8;
          }
          dVar38 = log(dVar38);
          this->outLogLikelihoodsTmp[lVar37] = dVar38;
          lVar37 = lVar37 + 1;
        } while (lVar37 != lVar21);
        if (iVar7 != -1) {
          if (iVar6 <= iVar5) goto LAB_0012bb1d;
          pdVar10 = this->gScaleBuffers[iVar7];
          pdVar11 = this->outLogLikelihoodsTmp;
          lVar37 = lVar22;
          do {
            pdVar11[lVar37] = pdVar10[lVar37] + pdVar11[lVar37];
            lVar37 = lVar37 + 1;
          } while (lVar21 != lVar37);
        }
        outSumLogLikelihoodByPartition[uVar25] = 0.0;
        if (iVar5 < iVar6) {
          pdVar10 = this->gPatternWeights;
          pdVar11 = this->outLogLikelihoodsTmp;
          auVar41 = ZEXT864(0) << 0x40;
          do {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = pdVar11[lVar22];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar10[lVar22];
            auVar40 = vfmadd231sd_fma(auVar41._0_16_,auVar46,auVar4);
            auVar41 = ZEXT1664(auVar40);
            lVar22 = lVar22 + 1;
            outSumLogLikelihoodByPartition[uVar25] = auVar40._0_8_;
          } while (lVar21 != lVar22);
        }
      }
      else {
LAB_0012bb1d:
        outSumLogLikelihoodByPartition[uVar25] = 0.0;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child
            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
                        //                        for(int j = 0; j < kStateCount; j++) {
                        //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                        //                            w++;
                        //                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}